

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O2

_Bool run_container_contains_range(run_container_t *run,uint32_t pos_start,uint32_t pos_end)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  _Bool _Var6;
  
  uVar3 = interleavedBinarySearch(run->runs,run->n_runs,(uint16_t)pos_start);
  if ((int)uVar3 < 0) {
    if (uVar3 != 0xffffffff) {
      uVar4 = (ulong)(-uVar3 - 2);
      if (pos_start - run->runs[uVar4].value <= (uint)run->runs[uVar4].length) goto LAB_001034cd;
    }
    _Var6 = false;
  }
  else {
    uVar4 = (ulong)uVar3;
LAB_001034cd:
    uVar3 = 0;
    for (; (int)uVar4 < run->n_runs; uVar4 = uVar4 + 1) {
      uVar1 = run->runs[uVar4].value;
      if (pos_end <= uVar1) break;
      uVar2 = run->runs[uVar4].length;
      if (pos_end <= (uint)uVar2 + (uint)uVar1) {
        uVar3 = (uVar3 + pos_end) - (uint)uVar1;
        break;
      }
      uVar5 = ((uint)uVar2 + (uint)uVar1) - pos_start;
      if (uVar2 <= uVar5) {
        uVar5 = (uint)uVar2;
      }
      uVar3 = uVar3 + uVar5;
    }
    _Var6 = ~pos_start + pos_end <= uVar3;
  }
  return _Var6;
}

Assistant:

static inline bool run_container_contains_range(const run_container_t *run,
                                                uint32_t pos_start,
                                                uint32_t pos_end) {
    uint32_t count = 0;
    int32_t index =
        interleavedBinarySearch(run->runs, run->n_runs, (uint16_t)pos_start);
    if (index < 0) {
        index = -index - 2;
        if ((index == -1) ||
            ((pos_start - run->runs[index].value) > run->runs[index].length)) {
            return false;
        }
    }
    for (int32_t i = index; i < run->n_runs; ++i) {
        const uint32_t stop = run->runs[i].value + run->runs[i].length;
        if (run->runs[i].value >= pos_end) break;
        if (stop >= pos_end) {
            count += (((pos_end - run->runs[i].value) > 0)
                          ? (pos_end - run->runs[i].value)
                          : 0);
            break;
        }
        const uint32_t min = (stop - pos_start) > 0 ? (stop - pos_start) : 0;
        count += (min < run->runs[i].length) ? min : run->runs[i].length;
    }
    return count >= (pos_end - pos_start - 1);
}